

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

sc_signed * sc_dt::operator-(sc_signed *__return_storage_ptr__,sc_signed *u,long v)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  int s;
  sc_digit vd [3];
  
  if (v == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,u);
  }
  else {
    uVar3 = -v;
    if ((ulong)v < 0x8000000000000001) {
      uVar3 = 0x8000000000000000;
    }
    if (0 < v) {
      uVar3 = v;
    }
    s = (uint)(v < 1) * 2 + -1;
    __n = 0xc;
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      vd[uVar4] = (uint)uVar3 & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar4) break;
      bVar1 = 0x3fffffff < uVar3;
      uVar3 = uVar3 >> 0x1e;
      uVar2 = uVar4 + 1;
    } while (bVar1);
    if (uVar4 < 2) {
      memset(vd + uVar4 + 1,0,__n);
    }
    if (u->sgn == 0) {
      sc_signed::sc_signed(__return_storage_ptr__,s,0x40,3,vd,false);
    }
    else {
      add_signed_friend(__return_storage_ptr__,u->sgn,u->nbits,u->ndigits,u->digit,s,0x40,3,vd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator-(const sc_signed &u, long v)
{

  if (v == 0) // case 1
    return sc_signed(u);

  CONVERT_LONG(v);

  if (u.sgn == SC_ZERO) // case 2
    return sc_signed(-vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd, false);

  // cases 3 and 4
  return add_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           -vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd);

}